

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdNode * Cudd_bddPickOneMinterm(DdManager *dd,DdNode *f,DdNode **vars,int n)

{
  int *piVar1;
  int iVar2;
  char *string;
  char *__ptr;
  ulong uVar3;
  ulong uVar4;
  DdNode *pDVar5;
  ulong uVar6;
  long lVar7;
  DdNode *f_00;
  
  string = (char *)malloc((long)dd->size);
  if (string == (char *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __ptr = (char *)malloc((long)n << 2);
    if (__ptr == (char *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar6 = (ulong)(uint)n;
      if (0 < n) {
        uVar3 = 0;
        do {
          *(DdHalfWord *)(__ptr + uVar3 * 4) = vars[uVar3]->index;
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      iVar2 = Cudd_bddPickOneCube(dd,f,string);
      if (iVar2 != 0) {
        if (0 < n) {
          uVar3 = 0;
          do {
            iVar2 = *(int *)(__ptr + uVar3 * 4);
            if (string[iVar2] == '\x02') {
              uVar4 = Cudd_Random();
              string[iVar2] = (byte)(uVar4 >> 5) & 1;
            }
            uVar3 = uVar3 + 1;
          } while (uVar6 != uVar3);
        }
        pDVar5 = Cudd_ReadOne(dd);
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        if (0 < n) {
          lVar7 = uVar6 + 1;
          f_00 = pDVar5;
          do {
            pDVar5 = Cudd_bddAnd(dd,f_00,(DdNode *)
                                         ((ulong)(string[*(int *)(__ptr + lVar7 * 4 + -8)] == '\0')
                                         ^ (ulong)vars[lVar7 + -2]));
            if (pDVar5 == (DdNode *)0x0) {
              free(string);
              free(__ptr);
              Cudd_RecursiveDeref(dd,f_00);
              return (DdNode *)0x0;
            }
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,f_00);
            lVar7 = lVar7 + -1;
            f_00 = pDVar5;
          } while (1 < lVar7);
        }
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        free(string);
        free(__ptr);
        return pDVar5;
      }
      free(string);
      string = __ptr;
    }
    free(string);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddPickOneMinterm(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick one minterm */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */)
{
    char *string;
    int i, size;
    int *indices;
    int result;
    DdNode *old, *neW;

    size = dd->size;
    string = ABC_ALLOC(char, size);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = Cudd_bddPickOneCube(dd,f,string);
    if (result == 0) {
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    /* Randomize choice for don't cares. */
    for (i = 0; i < n; i++) {
        if (string[indices[i]] == 2)
            string[indices[i]] = (char) ((Cudd_Random() & 0x20) >> 5);
    }

    /* Build result BDD. */
    old = Cudd_ReadOne(dd);
    cuddRef(old);

    for (i = n-1; i >= 0; i--) {
        neW = Cudd_bddAnd(dd,old,Cudd_NotCond(vars[i],string[indices[i]]==0));
        if (neW == NULL) {
            ABC_FREE(string);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,old);
            return(NULL);
        }
        cuddRef(neW);
        Cudd_RecursiveDeref(dd,old);
        old = neW;
    }

#ifdef DD_DEBUG
    /* Test. */
    if (Cudd_bddLeq(dd,old,f)) {
        cuddDeref(old);
    } else {
        Cudd_RecursiveDeref(dd,old);
        old = NULL;
    }
#else
    cuddDeref(old);
#endif

    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}